

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  string *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference filename_00;
  size_type sVar9;
  pointer this_00;
  string_view algo_00;
  char *local_2928;
  char *local_28e0;
  string local_2648 [32];
  undefined1 local_2628 [8];
  ostringstream cmCPackLog_msg_18;
  allocator<char> local_24a9;
  string local_24a8;
  string local_2488;
  string local_2468 [32];
  undefined1 local_2448 [8];
  ostringstream cmCPackLog_msg_17;
  undefined1 local_22d0 [8];
  ofstream outF;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2090;
  allocator<char> local_2069;
  string local_2068;
  cmValue local_2048;
  string local_2040 [8];
  string hashFile;
  undefined1 local_2000 [8];
  ostringstream cmCPackLog_msg_16;
  string local_1e88 [38];
  byte local_1e62;
  allocator<char> local_1e61;
  string local_1e60 [32];
  undefined1 local_1e40 [8];
  ostringstream cmCPackLog_msg_15;
  Status local_1cc8;
  string local_1cc0 [38];
  byte local_1c9a;
  allocator<char> local_1c99;
  string local_1c98 [32];
  undefined1 local_1c78 [8];
  ostringstream cmCPackLog_msg_14;
  char *packageFileName;
  cmValue local_1ad8;
  undefined1 local_1ad0 [8];
  string filename;
  string local_1aa8;
  cmValue local_1a88;
  undefined1 local_1a80 [8];
  string tmpPF;
  string *pkgFileName;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_1a20 [8];
  ostringstream cmCPackLog_msg_13;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> local_1898;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  string local_1888;
  cmValue local_1868;
  cmValue algo;
  undefined1 local_1840 [8];
  ostringstream cmCPackLog_msg_12;
  string local_16c8 [32];
  undefined1 local_16a8 [8];
  ostringstream cmCPackLog_msg_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *script;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_1508 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scripts;
  string_view local_14e0;
  string local_14d0;
  string_view local_14b0;
  allocator<char> local_1499;
  string local_1498;
  allocator<char> local_1471;
  string local_1470;
  cmValue local_1450;
  cmValue postBuildScripts;
  undefined1 local_1428 [8];
  ostringstream cmCPackLog_msg_10;
  string local_12b0;
  allocator<char> local_1289;
  string local_1288;
  ScopePushPop local_1268;
  ScopePushPop pp;
  string local_1258;
  string *local_1238;
  allocator<char> local_1229;
  string local_1228;
  string *local_1208;
  Status local_1200;
  string local_11f8 [32];
  undefined1 local_11d8 [8];
  ostringstream cmCPackLog_msg_9;
  string local_1060 [38];
  byte local_103a;
  allocator<char> local_1039;
  string local_1038 [32];
  undefined1 local_1018 [8];
  ostringstream cmCPackLog_msg_8;
  string local_ea0 [32];
  undefined1 local_e80 [8];
  ostringstream cmCPackLog_msg_7;
  string local_d00 [32];
  undefined1 local_ce0 [8];
  ostringstream cmCPackLog_msg_6;
  cmAlphaNum local_b68;
  string *local_b38;
  cmAlphaNum local_b30;
  undefined1 local_b00 [8];
  string findExpr;
  Glob gl;
  ostringstream local_a68 [8];
  ostringstream cmCPackLog_msg_5;
  allocator<char> local_8e9;
  string local_8e8;
  cmValue local_8c8;
  cmValue tempDirectory;
  string local_8b8;
  cmValue local_898;
  cmValue tempPackageFileName;
  ostringstream local_870 [8];
  ostringstream cmCPackLog_msg_4;
  string local_6f8 [32];
  ostringstream local_6d8 [8];
  ostringstream cmCPackLog_msg_3;
  string local_560 [32];
  string *local_540;
  ostringstream local_538 [8];
  ostringstream cmCPackLog_msg_2;
  string local_3c0 [32];
  string *local_3a0;
  ostringstream local_398 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_219;
  string local_218;
  cmValue local_1f8;
  cmValue toplevelDirectory;
  string local_1e8;
  string *local_1c8;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar6 = std::operator<<((ostream *)local_190,"Create package using ");
  poVar6 = std::operator<<(poVar6,(string *)&this->Name);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x40e,pcVar7);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  iVar5 = PrepareNames(this);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = (*this->_vptr_cmCPackGenerator[6])();
  if (iVar5 == 0) {
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",
             (allocator<char> *)((long)&toplevelDirectory.Value + 7));
  local_1c8 = (string *)GetOption(this,&local_1e8);
  bVar3 = cmIsOn((cmValue)local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&toplevelDirectory.Value + 7));
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"CPACK_TOPLEVEL_DIRECTORY",&local_219);
    local_1f8 = GetOption(this,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    psVar8 = cmValue::operator_cast_to_string_(&local_1f8);
    bVar3 = cmsys::SystemTools::FileExists(psVar8);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar6 = std::operator<<((ostream *)local_398,"Remove toplevel directory: ");
      local_3a0 = local_1f8.Value;
      poVar6 = ::operator<<(poVar6,local_1f8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x420,pcVar7);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::ostringstream::~ostringstream(local_398);
      psVar8 = cmValue::operator_cast_to_string_(&local_1f8);
      bVar3 = cmSystemTools::RepeatedRemoveDirectory(psVar8);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_538);
        poVar6 = std::operator<<((ostream *)local_538,"Problem removing toplevel directory: ");
        local_540 = local_1f8.Value;
        poVar6 = ::operator<<(poVar6,local_1f8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x424,pcVar7);
        std::__cxx11::string::~string(local_560);
        std::__cxx11::ostringstream::~ostringstream(local_538);
        return 0;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_6d8);
  poVar6 = std::operator<<((ostream *)local_6d8,"About to install project ");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42a,pcVar7);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::ostringstream::~ostringstream(local_6d8);
  iVar5 = InstallProject(this);
  if (iVar5 == 0) {
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_870);
  poVar6 = std::operator<<((ostream *)local_870,"Done install project ");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x42f,pcVar7);
  std::__cxx11::string::~string((string *)&tempPackageFileName);
  std::__cxx11::ostringstream::~ostringstream(local_870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)((long)&tempDirectory.Value + 7));
  local_898 = GetOption(this,&local_8b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tempDirectory.Value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"CPACK_TEMPORARY_DIRECTORY",&local_8e9);
  local_8c8 = GetOption(this,&local_8e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::__cxx11::ostringstream::ostringstream(local_a68);
  poVar6 = std::operator<<((ostream *)local_a68,"Find files");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x435,pcVar7);
  std::__cxx11::string::~string((string *)&gl.ListDirs);
  std::__cxx11::ostringstream::~ostringstream(local_a68);
  cmsys::Glob::Glob((Glob *)((long)&findExpr.field_2 + 8));
  local_b38 = local_8c8.Value;
  cmAlphaNum::cmAlphaNum(&local_b30,local_8c8);
  cmAlphaNum::cmAlphaNum(&local_b68,"/*");
  cmStrCat<>((string *)local_b00,&local_b30,&local_b68);
  cmsys::Glob::RecurseOn((Glob *)((long)&findExpr.field_2 + 8));
  cmsys::Glob::SetRecurseListDirs((Glob *)((long)&findExpr.field_2 + 8),true);
  cmsys::Glob::SetRecurseThroughSymlinks((Glob *)((long)&findExpr.field_2 + 8),false);
  bVar3 = cmsys::Glob::FindFiles
                    ((Glob *)((long)&findExpr.field_2 + 8),(string *)local_b00,(GlobMessages *)0x0);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e80);
    poVar6 = std::operator<<((ostream *)local_e80,"Create package");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x441,pcVar7);
    std::__cxx11::string::~string(local_ea0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e80);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1018);
    poVar6 = std::operator<<((ostream *)local_1018,"Package files to: ");
    bVar3 = cmValue::operator_cast_to_bool(&local_898);
    local_103a = 0;
    if (bVar3) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_898);
      std::__cxx11::string::string(local_1038,(string *)psVar8);
    }
    else {
      std::allocator<char>::allocator();
      local_103a = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_1038,"(NULL)",&local_1039);
    }
    poVar6 = std::operator<<(poVar6,local_1038);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1038);
    if ((local_103a & 1) != 0) {
      std::allocator<char>::~allocator(&local_1039);
    }
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x445,pcVar7);
    std::__cxx11::string::~string(local_1060);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1018);
    psVar8 = cmValue::operator_cast_to_string_(&local_898);
    bVar3 = cmsys::SystemTools::FileExists(psVar8);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11d8);
      poVar6 = std::operator<<((ostream *)local_11d8,"Remove old package file");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x448,pcVar7);
      std::__cxx11::string::~string(local_11f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11d8);
      psVar8 = cmValue::operator_cast_to_string_(&local_898);
      local_1200 = cmsys::SystemTools::RemoveFile(psVar8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1228,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",&local_1229);
    local_1208 = (string *)GetOption(this,&local_1228);
    bVar3 = cmIsOn((cmValue)local_1208);
    std::__cxx11::string::~string((string *)&local_1228);
    std::allocator<char>::~allocator(&local_1229);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1258,"CPACK_TOPLEVEL_DIRECTORY",
                 (allocator<char> *)((long)&pp.Makefile + 7));
      local_1238 = (string *)GetOption(this,&local_1258);
      local_8c8 = (cmValue)local_1238;
      std::__cxx11::string::~string((string *)&local_1258);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pp.Makefile + 7));
    }
    __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&findExpr.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->files,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->packageFileNames);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<cmValue&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->packageFileNames,&local_898);
    psVar8 = cmValue::operator*[abi_cxx11_(&local_8c8);
    std::__cxx11::string::operator=((string *)&this->toplevel,(string *)psVar8);
    cmMakefile::ScopePushPop::ScopePushPop(&local_1268,this->MakefileMap);
    pcVar2 = this->MakefileMap;
    pcVar7 = cmVersion::GetCMakeVersion();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1288,pcVar7,&local_1289);
    std::__cxx11::string::string((string *)&local_12b0);
    cmMakefile::SetPolicyVersion(pcVar2,&local_1288,&local_12b0);
    std::__cxx11::string::~string((string *)&local_12b0);
    std::__cxx11::string::~string((string *)&local_1288);
    std::allocator<char>::~allocator(&local_1289);
    iVar5 = (*this->_vptr_cmCPackGenerator[9])();
    if ((iVar5 == 0) || (bVar3 = cmSystemTools::GetErrorOccurredFlag(), bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1428);
      poVar6 = std::operator<<((ostream *)local_1428,"Problem compressing the directory");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x462,pcVar7);
      std::__cxx11::string::~string((string *)&postBuildScripts);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1428);
      this_local._4_4_ = 0;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    cmMakefile::ScopePushPop::~ScopePushPop(&local_1268);
    if (!bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1470,"CPACK_POST_BUILD_SCRIPTS",&local_1471);
      local_1450 = GetOption(this,&local_1470);
      std::__cxx11::string::~string((string *)&local_1470);
      std::allocator<char>::~allocator(&local_1471);
      bVar3 = cmValue::operator_cast_to_bool(&local_1450);
      if (bVar3) {
        pcVar2 = this->MakefileMap;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1498,"CPACK_PACKAGE_FILES",&local_1499);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_14e0,";");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   &scripts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmJoin(&local_14d0,&this->packageFileNames,local_14e0,stack0xffffffffffffeb10);
        local_14b0 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_14d0)
        ;
        cmMakefile::AddDefinition(pcVar2,&local_1498,local_14b0);
        std::__cxx11::string::~string((string *)&local_14d0);
        std::__cxx11::string::~string((string *)&local_1498);
        std::allocator<char>::~allocator(&local_1499);
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1508,local_1450,false);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1508);
        script = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1508);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&script);
          if (!bVar3) break;
          filename_00 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a8);
          poVar6 = std::operator<<((ostream *)local_16a8,"Executing post-build script: ");
          poVar6 = std::operator<<(poVar6,(string *)filename_00);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x46f,pcVar7);
          std::__cxx11::string::~string(local_16c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a8);
          bVar3 = cmMakefile::ReadListFile(this->MakefileMap,filename_00);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1840);
            poVar6 = std::operator<<((ostream *)local_1840,"The post-build script not found: ");
            poVar6 = std::operator<<(poVar6,(string *)filename_00);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x474,pcVar7);
            std::__cxx11::string::~string((string *)&algo);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1840);
            this_local._4_4_ = 0;
            bVar3 = true;
            goto LAB_0017f4bd;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        bVar3 = false;
LAB_0017f4bd:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1508);
        if (bVar3) goto LAB_00180662;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1888,"CPACK_PACKAGE_CHECKSUM",
                 (allocator<char> *)
                 ((long)&crypto._M_t.
                         super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl + 7));
      local_1868 = GetOption(this,&local_1888);
      std::__cxx11::string::~string((string *)&local_1888);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&crypto._M_t.
                         super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl + 7));
      psVar8 = cmValue::operator*[abi_cxx11_(&local_1868);
      pcVar7 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
      algo_00._M_str = pcVar7;
      algo_00._M_len = (size_t)&local_1898;
      cmCryptoHash::New(algo_00);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a20);
      poVar6 = std::operator<<((ostream *)local_1a20,"Copying final package(s) [");
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->packageFileNames);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar9);
      poVar6 = std::operator<<(poVar6,"]:");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x486,pcVar7);
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a20);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->packageFileNames);
      pkgFileName = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&this->packageFileNames);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&pkgFileName);
        if (!bVar3) break;
        tmpPF.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1aa8,"CPACK_OUTPUT_FILE_PREFIX",
                   (allocator<char> *)(filename.field_2._M_local_buf + 0xf));
        local_1a88 = GetOption(this,&local_1aa8);
        psVar8 = cmValue::operator_cast_to_string_(&local_1a88);
        std::__cxx11::string::string((string *)local_1a80,(string *)psVar8);
        std::__cxx11::string::~string((string *)&local_1aa8);
        std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
        cmsys::SystemTools::GetFilenameName((string *)local_1ad0,(string *)tmpPF.field_2._8_8_);
        cmValue::cmValue(&local_1ad8,(string *)tmpPF.field_2._8_8_);
        local_898.Value = local_1ad8.Value;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &packageFileName,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1ad0);
        std::__cxx11::string::operator+=((string *)local_1a80,(string *)&packageFileName);
        std::__cxx11::string::~string((string *)&packageFileName);
        local_2928 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c78);
        poVar6 = std::operator<<((ostream *)local_1c78,"Copy final package(s): ");
        bVar3 = cmValue::operator_cast_to_bool(&local_898);
        local_1c9a = 0;
        if (bVar3) {
          psVar8 = cmValue::operator*[abi_cxx11_(&local_898);
          std::__cxx11::string::string(local_1c98,(string *)psVar8);
        }
        else {
          std::allocator<char>::allocator();
          local_1c9a = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_1c98,"(NULL)",&local_1c99);
        }
        poVar6 = std::operator<<(poVar6,local_1c98);
        poVar6 = std::operator<<(poVar6," to ");
        local_28e0 = local_2928;
        if (local_2928 == (char *)0x0) {
          local_28e0 = "(NULL)";
        }
        poVar6 = std::operator<<(poVar6,local_28e0);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1c98);
        if ((local_1c9a & 1) != 0) {
          std::allocator<char>::~allocator(&local_1c99);
        }
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x492,pcVar7);
        std::__cxx11::string::~string(local_1cc0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c78);
        local_1cc8 = cmsys::SystemTools::CopyFileIfDifferent
                               ((string *)tmpPF.field_2._8_8_,(string *)local_1a80);
        bVar3 = cmsys::Status::operator_cast_to_bool(&local_1cc8);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2000);
          poVar6 = std::operator<<((ostream *)local_2000,"- package: ");
          poVar6 = std::operator<<(poVar6,local_2928);
          poVar6 = std::operator<<(poVar6," generated.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x49d,pcVar7);
          std::__cxx11::string::~string((string *)(hashFile.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2000);
          bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_1898);
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2068,"CPACK_OUTPUT_FILE_PREFIX",&local_2069);
            local_2048 = GetOption(this,&local_2068);
            psVar8 = cmValue::operator_cast_to_string_(&local_2048);
            std::__cxx11::string::string(local_2040,(string *)psVar8);
            std::__cxx11::string::~string((string *)&local_2068);
            std::allocator<char>::~allocator(&local_2069);
            std::operator+(&local_2090,"/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1ad0);
            std::__cxx11::string::operator+=(local_2040,(string *)&local_2090);
            std::__cxx11::string::~string((string *)&local_2090);
            psVar8 = cmValue::operator_cast_to_string_(&local_1868);
            cmsys::SystemTools::LowerCase((string *)&outF.field_0x1f8,psVar8);
            std::operator+(&local_20b0,".",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &outF.field_0x1f8);
            std::__cxx11::string::operator+=(local_2040,(string *)&local_20b0);
            std::__cxx11::string::~string((string *)&local_20b0);
            std::__cxx11::string::~string((string *)&outF.field_0x1f8);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            std::ofstream::ofstream(local_22d0,pcVar7,_S_out);
            bVar4 = std::ios::operator!((ios *)(local_22d0 +
                                               (long)*(_func_int **)((long)local_22d0 + -0x18)));
            bVar3 = (bVar4 & 1) != 0;
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2448);
              poVar6 = std::operator<<((ostream *)local_2448,"Cannot create checksum file: ");
              poVar6 = std::operator<<(poVar6,local_2040);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x4a8,pcVar7);
              std::__cxx11::string::~string(local_2468);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2448);
              this_local._4_4_ = 0;
            }
            else {
              this_00 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                        operator->(&local_1898);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_24a8,local_2928,&local_24a9);
              cmCryptoHash::HashFile(&local_2488,this_00,&local_24a8);
              poVar6 = std::operator<<((ostream *)local_22d0,(string *)&local_2488);
              poVar6 = std::operator<<(poVar6,"  ");
              poVar6 = std::operator<<(poVar6,(string *)local_1ad0);
              std::operator<<(poVar6,"\n");
              std::__cxx11::string::~string((string *)&local_2488);
              std::__cxx11::string::~string((string *)&local_24a8);
              std::allocator<char>::~allocator(&local_24a9);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2628);
              poVar6 = std::operator<<((ostream *)local_2628,"- checksum file: ");
              poVar6 = std::operator<<(poVar6,local_2040);
              poVar6 = std::operator<<(poVar6," generated.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar7 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x4ae,pcVar7);
              std::__cxx11::string::~string(local_2648);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2628);
            }
            std::ofstream::~ofstream(local_22d0);
            std::__cxx11::string::~string(local_2040);
            if (bVar3) goto LAB_001805e4;
          }
          bVar3 = false;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e40);
          poVar6 = std::operator<<((ostream *)local_1e40,"Problem copying the package: ");
          bVar3 = cmValue::operator_cast_to_bool(&local_898);
          local_1e62 = 0;
          if (bVar3) {
            psVar8 = cmValue::operator*[abi_cxx11_(&local_898);
            std::__cxx11::string::string(local_1e60,(string *)psVar8);
          }
          else {
            std::allocator<char>::allocator();
            local_1e62 = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_1e60,"(NULL)",&local_1e61);
          }
          poVar6 = std::operator<<(poVar6,local_1e60);
          poVar6 = std::operator<<(poVar6," to ");
          if (local_2928 == (char *)0x0) {
            local_2928 = "(NULL)";
          }
          poVar6 = std::operator<<(poVar6,local_2928);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_1e60);
          if ((local_1e62 & 1) != 0) {
            std::allocator<char>::~allocator(&local_1e61);
          }
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x498,pcVar7);
          std::__cxx11::string::~string(local_1e88);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e40);
          this_local._4_4_ = 0;
          bVar3 = true;
        }
LAB_001805e4:
        std::__cxx11::string::~string((string *)local_1ad0);
        std::__cxx11::string::~string((string *)local_1a80);
        if (bVar3) goto LAB_00180646;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._4_4_ = 1;
LAB_00180646:
      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr(&local_1898);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ce0);
    poVar6 = std::operator<<((ostream *)local_ce0,"Cannot find any files in the packaging tree");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x43d,pcVar7);
    std::__cxx11::string::~string(local_d00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ce0);
    this_local._4_4_ = 0;
  }
LAB_00180662:
  std::__cxx11::string::~string((string *)local_b00);
  cmsys::Glob::~Glob((Glob *)((long)&findExpr.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmIsOn(this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    cmValue toplevelDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  cmValue tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  cmValue tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = cmStrCat(tempDirectory, "/*");
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? *tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmIsOn(this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  this->files = gl.GetFiles();

  this->packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  this->packageFileNames.emplace_back(tempPackageFileName);
  this->toplevel = *tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccurredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }
  // Run post-build actions
  cmValue postBuildScripts = this->GetOption("CPACK_POST_BUILD_SCRIPTS");
  if (postBuildScripts) {
    this->MakefileMap->AddDefinition("CPACK_PACKAGE_FILES",
                                     cmJoin(this->packageFileNames, ";"));

    const auto scripts = cmExpandedList(postBuildScripts, false);
    for (const auto& script : scripts) {
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "Executing post-build script: " << script << std::endl);

      if (!this->MakefileMap->ReadListFile(script)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "The post-build script not found: " << script
                                                          << std::endl);
        return 0;
      }
    }
  }

  /* Prepare checksum algorithm*/
  cmValue algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(*algo);

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << this->packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : this->packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = cmValue(pkgFileName);
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? *tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? *tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}